

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall FPolyObj::UnLinkPolyobj(FPolyObj *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  polyblock_t *ppVar4;
  long lVar5;
  long lVar6;
  polyblock_t **pppVar7;
  long lVar8;
  
  lVar5 = (long)this->bbox[1];
  iVar1 = this->bbox[0];
  lVar6 = (long)bmapwidth;
  iVar2 = this->bbox[2];
  iVar3 = this->bbox[3];
  do {
    if (iVar1 < lVar5) {
      return;
    }
    for (lVar8 = (long)iVar2; lVar8 <= iVar3; lVar8 = lVar8 + 1) {
      if ((((-1 < lVar8) && (-1 < lVar5)) && (lVar8 < lVar6)) && (lVar5 < bmapheight)) {
        pppVar7 = PolyBlockMap + lVar8 + lVar5 * lVar6;
        while (ppVar4 = *pppVar7, ppVar4 != (polyblock_t *)0x0) {
          if (ppVar4->polyobj == this) {
            ppVar4->polyobj = (FPolyObj *)0x0;
            break;
          }
          pppVar7 = &ppVar4->next;
        }
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void FPolyObj::UnLinkPolyobj ()
{
	polyblock_t *link;
	int i, j;
	int index;

	// remove the polyobj from each blockmap section
	for(j = bbox[BOXBOTTOM]; j <= bbox[BOXTOP]; j++)
	{
		index = j*bmapwidth;
		for(i = bbox[BOXLEFT]; i <= bbox[BOXRIGHT]; i++)
		{
			if(i >= 0 && i < bmapwidth && j >= 0 && j < bmapheight)
			{
				link = PolyBlockMap[index+i];
				while(link != NULL && link->polyobj != this)
				{
					link = link->next;
				}
				if(link == NULL)
				{ // polyobj not located in the link cell
					continue;
				}
				link->polyobj = NULL;
			}
		}
	}
}